

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bob.cpp
# Opt level: O2

void __thiscall Bob::ObliviousExecute(Bob *this)

{
  long *plVar1;
  pointer pvVar2;
  string op;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  char *arg1;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  Message MVar12;
  long lVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffff98;
  allocator local_31;
  
  if (ObliviousExecute()::fout == '\0') {
    iVar3 = __cxa_guard_acquire(&ObliviousExecute()::fout);
    if (iVar3 != 0) {
      std::ofstream::ofstream(ObliviousExecute()::fout,"../debug/bob/Debug_B.txt",_S_out);
      __cxa_atexit(std::ofstream::~ofstream,ObliviousExecute()::fout,&__dso_handle);
      __cxa_guard_release(&ObliviousExecute()::fout);
    }
  }
  poVar4 = std::operator<<((ostream *)ObliviousExecute()::fout,"Bob: Oblivious Execute Run # ");
  iVar3 = ObliviousExecute::count;
  ObliviousExecute::count = ObliviousExecute::count + 1;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)ObliviousExecute()::fout,"Bob: pc = ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::operator<<(poVar4,"\n");
  plVar1 = (this->super_Party).P.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(this->super_Party).pc].
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  lVar5 = *plVar1;
  lVar13 = plVar1[1];
  MVar12 = Client::Receive(this->cli);
  poVar4 = std::operator<<((ostream *)ObliviousExecute()::fout,"Bob: Msg rcvd from Alice : ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::operator<<(poVar4,"\n");
  Client::Send(this->cli,(Message *)&stack0xffffffffffffff88);
  poVar4 = std::operator<<((ostream *)ObliviousExecute()::fout,"Bob: Msg sent to Alice : ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::operator<<(poVar4,"\n");
  plVar1 = (this->super_Party).P.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(this->super_Party).pc].
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  uVar9 = MVar12.scalar1 + *plVar1;
  uVar7 = MVar12.scalar2 + plVar1[1];
  poVar4 = std::operator<<((ostream *)ObliviousExecute()::fout,"Bob: a = ");
  iVar8 = (int)uVar9;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar8);
  poVar4 = std::operator<<(poVar4," b = ");
  iVar3 = (int)uVar7;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::operator<<(poVar4,"\n");
  if (((iVar8 < 0) || (iVar3 < 0)) || (iVar8 == 0 && iVar3 == 0)) {
    (this->super_Party).termination_condition = true;
  }
  else {
    pvVar2 = (this->super_Party).D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar1 = pvVar2[uVar9 & 0x7fffffff].super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = *plVar1 - *pvVar2[uVar7 & 0x7fffffff].super__Vector_base<long,_std::allocator<long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    *plVar1 = lVar6;
    (this->super_Party).output = lVar6;
    arg1 = ">=";
    std::__cxx11::string::string((string *)&stack0xffffffffffffff98,">=",&local_31);
    op._M_string_length = lVar13;
    op._M_dataplus._M_p = (pointer)lVar5;
    op.field_2 = in_stack_ffffffffffffff98;
    lVar5 = ObliviousComparison(this,op,(long)arg1,0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    poVar4 = std::operator<<((ostream *)ObliviousExecute()::fout,"Bob: OC output  beta\" = ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::operator<<(poVar4,"\n");
    dVar10 = ObliviousMultiplication
                       (this,lVar5,
                        *(long *)(*(long *)&(this->super_Party).P.
                                            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start
                                            [(this->super_Party).pc].
                                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                            super__Vector_impl_data + 0x10));
    std::operator<<((ostream *)ObliviousExecute()::fout,"Bob: OM output beta\"* P\"[pc][2] : ");
    poVar4 = std::ostream::_M_insert<double>(dVar10);
    std::operator<<(poVar4,"\n");
    dVar11 = ObliviousMultiplication
                       (this,-lVar5,
                        *(long *)(*(long *)&(this->super_Party).P.
                                            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start
                                            [(this->super_Party).pc].
                                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                            super__Vector_impl_data + 0x18));
    std::operator<<((ostream *)ObliviousExecute()::fout,"Bob: OM output (-beta\")(P\"[pc][3]) : ");
    poVar4 = std::ostream::_M_insert<double>(dVar11);
    std::operator<<(poVar4,"\n");
    (this->super_Party).pc = (long)(dVar10 + dVar11);
  }
  return;
}

Assistant:

void Bob::ObliviousExecute()
{
    static std::ofstream fout("../debug/bob/Debug_B.txt");
    static int count = 0;
    fout<<"Bob: Oblivious Execute Run # "<<count++<<"\n";
    fout<<"Bob: pc = "<<pc<<"\n";
    /*------- Step 1 -------*/
    Message msg_for_Alice, msg_from_Alice;
    msg_for_Alice.scalar1 = P[pc][0];
    msg_for_Alice.scalar2 = P[pc][1];
    msg_from_Alice = cli->Receive();
    fout<<"Bob: Msg rcvd from Alice : "<<msg_from_Alice.scalar1 << " "<<msg_from_Alice.scalar2<<"\n";
    cli->Send(msg_for_Alice);
    fout<<"Bob: Msg sent to Alice : "<<msg_for_Alice.scalar1 << " "<<msg_for_Alice.scalar2<<"\n";
    /*------- Step 2 -------*/
    int a = P[pc][0] + msg_from_Alice.scalar1;
    int b = P[pc][1] + msg_from_Alice.scalar2;
    fout<<"Bob: a = "<<a<<" b = "<<b<<"\n";
    if(a<0 || b<0 ||(a==0 && b==0)){
        termination_condition =  true;
        return;
    }        
    /*------- Step 3 -------*/
    D[a][0] = D[a][0] - D[b][0];
    output = D[a][0];
    /*------- Step 4 -------*/
    long beta = ObliviousComparison(">=", 0, D[a][0]);
    fout<<"Bob: OC output  beta\" = "<<beta<<"\n";
    /*------- Step 5 -------*/
    double next_pc = ObliviousMultiplication(beta, P[pc][2]);
    fout<< "Bob: OM output beta\"* P\"[pc][2] : "<<next_pc<<"\n";
    double temp = ObliviousMultiplication(-beta, P[pc][3]);
    fout<< "Bob: OM output (-beta\")(P\"[pc][3]) : "<<temp<<"\n";
    pc = next_pc + temp;    
}